

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIfCommand.cxx
# Opt level: O1

bool __thiscall
cmIfFunctionBlocker::IsFunctionBlocked
          (cmIfFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *inStatus)

{
  uint *puVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  pointer pcVar7;
  cmake *pcVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  cmExecutionStatus status;
  MessageType messType;
  string errorString;
  string err;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  cmListFileContext conditionContext;
  cmListFileBacktrace bt;
  cmConditionEvaluator conditionEvaluator;
  cmExecutionStatus local_19c;
  cmMakefile *local_198;
  MessageType local_18c;
  string local_188;
  cmExecutionStatus *local_168;
  undefined1 local_160 [32];
  cmMakefile *local_140;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> local_138;
  cmListFileContext local_120;
  string *local_d8;
  cmListFileBacktrace local_d0;
  cmMakefile *local_b0;
  
  iVar4 = cmsys::SystemTools::Strucmp((lff->super_cmCommandContext).Name._M_dataplus._M_p,"if");
  if (iVar4 == 0) {
    this->ScopeDepth = this->ScopeDepth + 1;
  }
  else {
    iVar4 = cmsys::SystemTools::Strucmp((lff->super_cmCommandContext).Name._M_dataplus._M_p,"endif")
    ;
    if (iVar4 == 0) {
      puVar1 = &this->ScopeDepth;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        local_168 = inStatus;
        cmMakefile::RemoveFunctionBlocker
                  ((cmMakefile *)&stack0xffffffffffffff50,(cmFunctionBlocker *)mf,
                   (cmListFileFunction *)this);
        bVar11 = local_b0 != (cmMakefile *)0x0;
        if (bVar11) {
          local_140 = local_b0;
          local_19c.ReturnInvoked = false;
          local_19c.BreakInvoked = false;
          local_19c.ContinueInvoked = false;
          local_19c.NestedError = false;
          pcVar7 = (this->Functions).
                   super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          local_198 = mf;
          if ((this->Functions).
              super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
              super__Vector_impl_data._M_finish != pcVar7) {
            local_d8 = &(this->super_cmFunctionBlocker).StartingContext.FilePath;
            uVar9 = 1;
            uVar10 = 0;
            iVar4 = 0;
            do {
              iVar5 = cmsys::SystemTools::Strucmp
                                (pcVar7[uVar10].super_cmCommandContext.Name._M_dataplus._M_p,"if");
              iVar6 = cmsys::SystemTools::Strucmp
                                ((this->Functions).
                                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar10].
                                 super_cmCommandContext.Name._M_dataplus._M_p,"endif");
              iVar4 = (iVar4 + (uint)(iVar5 == 0)) - (uint)(iVar6 == 0);
              if (iVar4 == 0) {
                iVar5 = cmsys::SystemTools::Strucmp
                                  ((this->Functions).
                                   super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar10].
                                   super_cmCommandContext.Name._M_dataplus._M_p,"else");
                pcVar2 = local_198;
                if (iVar5 == 0) {
                  if (this->ElseSeen == true) {
                    cmMakefile::GetBacktrace
                              ((cmListFileBacktrace *)&stack0xffffffffffffff50,local_198,
                               &(this->Functions).
                                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar10].
                                super_cmCommandContext);
                    pcVar8 = cmMakefile::GetCMakeInstance(pcVar2);
                    local_120.Name._M_dataplus._M_p = (pointer)&local_120.Name.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_120,
                               "A duplicate ELSE command was found inside an IF block.","");
                    cmake::IssueMessage(pcVar8,FATAL_ERROR,&local_120.Name,
                                        (cmListFileBacktrace *)&stack0xffffffffffffff50);
LAB_003703fb:
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_120.Name._M_dataplus._M_p != &local_120.Name.field_2) {
                      operator_delete(local_120.Name._M_dataplus._M_p,
                                      local_120.Name.field_2._M_allocated_capacity + 1);
                    }
                    cmSystemTools::s_FatalErrorOccured = true;
                    cmListFileBacktrace::~cmListFileBacktrace
                              ((cmListFileBacktrace *)&stack0xffffffffffffff50);
                    local_b0 = local_140;
                    break;
                  }
                  bVar3 = this->HasRun;
                  this->IsBlocking = bVar3;
                  this->HasRun = true;
                  this->ElseSeen = true;
                  if ((bVar3 == false) &&
                     (pcVar8 = cmMakefile::GetCMakeInstance(local_198), pcVar8->Trace == true)) {
                    cmMakefile::PrintCommandTrace
                              (local_198,
                               (this->Functions).
                               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar10);
                  }
                }
                else {
                  iVar5 = cmsys::SystemTools::Strucmp
                                    ((this->Functions).
                                     super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar10].
                                     super_cmCommandContext.Name._M_dataplus._M_p,"elseif");
                  pcVar2 = local_198;
                  if (iVar5 != 0) goto LAB_0036ffd4;
                  if (this->ElseSeen == true) {
                    cmMakefile::GetBacktrace
                              ((cmListFileBacktrace *)&stack0xffffffffffffff50,local_198,
                               &(this->Functions).
                                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar10].
                                super_cmCommandContext);
                    pcVar8 = cmMakefile::GetCMakeInstance(pcVar2);
                    local_120.Name._M_dataplus._M_p = (pointer)&local_120.Name.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_120,
                               "An ELSEIF command was found after an ELSE command.","");
                    cmake::IssueMessage(pcVar8,FATAL_ERROR,&local_120.Name,
                                        (cmListFileBacktrace *)&stack0xffffffffffffff50);
                    goto LAB_003703fb;
                  }
                  if (this->HasRun == true) {
                    this->IsBlocking = true;
                  }
                  else {
                    pcVar8 = cmMakefile::GetCMakeInstance(local_198);
                    if (pcVar8->Trace == true) {
                      cmMakefile::PrintCommandTrace
                                (local_198,
                                 (this->Functions).
                                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar10);
                    }
                    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                    local_188._M_string_length = 0;
                    local_188.field_2._M_local_buf[0] = '\0';
                    local_138.
                    super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    local_138.
                    super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    local_138.
                    super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    cmMakefile::ExpandArguments
                              (local_198,
                               &(this->Functions).
                                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar10].Arguments,
                               &local_138,(char *)0x0);
                    cmListFileContext::FromCommandContext
                              (&local_120,
                               &(this->Functions).
                                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar10].
                                super_cmCommandContext,local_d8);
                    pcVar2 = local_198;
                    cmMakefile::GetBacktrace
                              ((cmListFileBacktrace *)local_160,local_198,
                               &(this->Functions).
                                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar10].
                                super_cmCommandContext);
                    cmConditionEvaluator::cmConditionEvaluator
                              ((cmConditionEvaluator *)&stack0xffffffffffffff50,pcVar2,&local_120,
                               (cmListFileBacktrace *)local_160);
                    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_160);
                    bVar3 = cmConditionEvaluator::IsTrue
                                      ((cmConditionEvaluator *)&stack0xffffffffffffff50,&local_138,
                                       &local_188,&local_18c);
                    if (local_188._M_string_length != 0) {
                      cmIfCommandError_abi_cxx11_((string *)local_160,&local_138);
                      std::__cxx11::string::_M_append
                                ((char *)local_160,(ulong)local_188._M_dataplus._M_p);
                      pcVar2 = local_198;
                      cmMakefile::GetBacktrace
                                (&local_d0,local_198,
                                 &(this->Functions).
                                  super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar10].
                                  super_cmCommandContext);
                      pcVar8 = cmMakefile::GetCMakeInstance(pcVar2);
                      cmake::IssueMessage(pcVar8,local_18c,(string *)local_160,&local_d0);
                      if (local_18c == FATAL_ERROR) {
                        cmSystemTools::s_FatalErrorOccured = true;
                        cmListFileBacktrace::~cmListFileBacktrace(&local_d0);
                        if ((cmState *)local_160._0_8_ != (cmState *)(local_160 + 0x10)) {
                          operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
                        }
                        cmConditionEvaluator::~cmConditionEvaluator
                                  ((cmConditionEvaluator *)&stack0xffffffffffffff50);
                        cmListFileContext::~cmListFileContext(&local_120);
                        std::
                        vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                        ::~vector(&local_138);
                        local_b0 = local_140;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_188._M_dataplus._M_p != &local_188.field_2) {
                          operator_delete(local_188._M_dataplus._M_p,
                                          CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                                                   local_188.field_2._M_local_buf[0]) + 1);
                          local_b0 = local_140;
                        }
                        break;
                      }
                      cmListFileBacktrace::~cmListFileBacktrace(&local_d0);
                      if ((cmState *)local_160._0_8_ != (cmState *)(local_160 + 0x10)) {
                        operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
                      }
                    }
                    if (bVar3) {
                      this->IsBlocking = false;
                      this->HasRun = true;
                    }
                    cmConditionEvaluator::~cmConditionEvaluator
                              ((cmConditionEvaluator *)&stack0xffffffffffffff50);
                    cmListFileContext::~cmListFileContext(&local_120);
                    std::
                    vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
                    ~vector(&local_138);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_188._M_dataplus._M_p != &local_188.field_2) {
                      operator_delete(local_188._M_dataplus._M_p,
                                      CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                                               local_188.field_2._M_local_buf[0]) + 1);
                    }
                  }
                }
              }
              else {
LAB_0036ffd4:
                if (this->IsBlocking == false) {
                  local_19c.ReturnInvoked = false;
                  local_19c.BreakInvoked = false;
                  local_19c.ContinueInvoked = false;
                  local_19c.NestedError = false;
                  cmMakefile::ExecuteCommand
                            (local_198,
                             (this->Functions).
                             super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar10,&local_19c);
                  local_b0 = local_140;
                  if (local_19c.ReturnInvoked == true) {
                    local_168->ReturnInvoked = true;
                    break;
                  }
                  if (local_19c.BreakInvoked == true) {
                    local_168->BreakInvoked = true;
                    break;
                  }
                  if (local_19c.ContinueInvoked == true) {
                    local_168->ContinueInvoked = true;
                    break;
                  }
                }
              }
              uVar10 = (ulong)uVar9;
              pcVar7 = (this->Functions).
                       super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              uVar9 = uVar9 + 1;
              local_b0 = local_140;
            } while (uVar10 < (ulong)((long)(this->Functions).
                                            super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pcVar7 >> 6));
          }
        }
        if (local_b0 == (cmMakefile *)0x0) {
          return bVar11;
        }
        (**(code **)((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_b0->FindPackageModuleStack).
                            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Deque_impl_data._M_map)->field_2 + 8))();
        return bVar11;
      }
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
            (&this->Functions,lff);
  return true;
}

Assistant:

bool cmIfFunctionBlocker::IsFunctionBlocked(const cmListFileFunction& lff,
                                            cmMakefile& mf,
                                            cmExecutionStatus& inStatus)
{
  // we start by recording all the functions
  if (!cmSystemTools::Strucmp(lff.Name.c_str(), "if")) {
    this->ScopeDepth++;
  } else if (!cmSystemTools::Strucmp(lff.Name.c_str(), "endif")) {
    this->ScopeDepth--;
    // if this is the endif for this if statement, then start executing
    if (!this->ScopeDepth) {
      // Remove the function blocker for this scope or bail.
      CM_AUTO_PTR<cmFunctionBlocker> fb(mf.RemoveFunctionBlocker(this, lff));
      if (!fb.get()) {
        return false;
      }

      // execute the functions for the true parts of the if statement
      cmExecutionStatus status;
      int scopeDepth = 0;
      for (unsigned int c = 0; c < this->Functions.size(); ++c) {
        // keep track of scope depth
        if (!cmSystemTools::Strucmp(this->Functions[c].Name.c_str(), "if")) {
          scopeDepth++;
        }
        if (!cmSystemTools::Strucmp(this->Functions[c].Name.c_str(),
                                    "endif")) {
          scopeDepth--;
        }
        // watch for our state change
        if (scopeDepth == 0 &&
            !cmSystemTools::Strucmp(this->Functions[c].Name.c_str(), "else")) {

          if (this->ElseSeen) {
            cmListFileBacktrace bt = mf.GetBacktrace(this->Functions[c]);
            mf.GetCMakeInstance()->IssueMessage(
              cmake::FATAL_ERROR,
              "A duplicate ELSE command was found inside an IF block.", bt);
            cmSystemTools::SetFatalErrorOccured();
            return true;
          }

          this->IsBlocking = this->HasRun;
          this->HasRun = true;
          this->ElseSeen = true;

          // if trace is enabled, print a (trivially) evaluated "else"
          // statement
          if (!this->IsBlocking && mf.GetCMakeInstance()->GetTrace()) {
            mf.PrintCommandTrace(this->Functions[c]);
          }
        } else if (scopeDepth == 0 &&
                   !cmSystemTools::Strucmp(this->Functions[c].Name.c_str(),
                                           "elseif")) {
          if (this->ElseSeen) {
            cmListFileBacktrace bt = mf.GetBacktrace(this->Functions[c]);
            mf.GetCMakeInstance()->IssueMessage(
              cmake::FATAL_ERROR,
              "An ELSEIF command was found after an ELSE command.", bt);
            cmSystemTools::SetFatalErrorOccured();
            return true;
          }

          if (this->HasRun) {
            this->IsBlocking = true;
          } else {
            // if trace is enabled, print the evaluated "elseif" statement
            if (mf.GetCMakeInstance()->GetTrace()) {
              mf.PrintCommandTrace(this->Functions[c]);
            }

            std::string errorString;

            std::vector<cmExpandedCommandArgument> expandedArguments;
            mf.ExpandArguments(this->Functions[c].Arguments,
                               expandedArguments);

            cmake::MessageType messType;

            cmListFileContext conditionContext =
              cmListFileContext::FromCommandContext(
                this->Functions[c], this->GetStartingContext().FilePath);

            cmConditionEvaluator conditionEvaluator(
              mf, conditionContext, mf.GetBacktrace(this->Functions[c]));

            bool isTrue = conditionEvaluator.IsTrue(expandedArguments,
                                                    errorString, messType);

            if (!errorString.empty()) {
              std::string err = cmIfCommandError(expandedArguments);
              err += errorString;
              cmListFileBacktrace bt = mf.GetBacktrace(this->Functions[c]);
              mf.GetCMakeInstance()->IssueMessage(messType, err, bt);
              if (messType == cmake::FATAL_ERROR) {
                cmSystemTools::SetFatalErrorOccured();
                return true;
              }
            }

            if (isTrue) {
              this->IsBlocking = false;
              this->HasRun = true;
            }
          }
        }

        // should we execute?
        else if (!this->IsBlocking) {
          status.Clear();
          mf.ExecuteCommand(this->Functions[c], status);
          if (status.GetReturnInvoked()) {
            inStatus.SetReturnInvoked();
            return true;
          }
          if (status.GetBreakInvoked()) {
            inStatus.SetBreakInvoked();
            return true;
          }
          if (status.GetContinueInvoked()) {
            inStatus.SetContinueInvoked();
            return true;
          }
        }
      }
      return true;
    }
  }

  // record the command
  this->Functions.push_back(lff);

  // always return true
  return true;
}